

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmFunctionInfo.cpp
# Opt level: O0

void __thiscall
Wasm::WasmFunctionInfo::WasmFunctionInfo
          (WasmFunctionInfo *this,ArenaAllocator *alloc,WasmSignature *signature,uint32 number)

{
  ArgSlot AVar1;
  Local item;
  ArgSlot local_52;
  nullptr_t pvStack_50;
  ArgSlot i;
  nullptr_t local_48 [3];
  nullptr_t local_30;
  uint32 local_24;
  WasmSignature *pWStack_20;
  uint32 number_local;
  WasmSignature *signature_local;
  ArenaAllocator *alloc_local;
  WasmFunctionInfo *this_local;
  
  this->importedFunctionReference = (Type)0x0;
  this->m_alloc = alloc;
  local_24 = number;
  pWStack_20 = signature;
  signature_local = (WasmSignature *)alloc;
  alloc_local = (ArenaAllocator *)this;
  AVar1 = WasmSignature::GetParamCount(signature);
  JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::GrowingArray
            (&this->m_locals,alloc,(uint)AVar1);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&this->m_body,&local_30);
  Memory::WriteBarrierPtr<Wasm::WasmSignature>::WriteBarrierPtr(&this->m_signature,pWStack_20);
  local_48[0] = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Wasm::WasmReaderBase>::WriteBarrierPtr(&this->m_customReader,local_48);
  pvStack_50 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->m_name,&stack0xffffffffffffffb0);
  this->m_nameLength = 0;
  this->m_number = local_24;
  FunctionBodyReaderInfo::FunctionBodyReaderInfo(&this->m_readerInfo,0,0);
  local_52 = 0;
  while( true ) {
    AVar1 = WasmSignature::GetParamCount(pWStack_20);
    if (AVar1 <= local_52) break;
    item = WasmSignature::GetParam(pWStack_20,local_52);
    JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::Add
              (&this->m_locals,item);
    local_52 = local_52 + 1;
  }
  return;
}

Assistant:

WasmFunctionInfo::WasmFunctionInfo(ArenaAllocator* alloc, WasmSignature* signature, uint32 number) : 
    m_alloc(alloc),
    m_signature(signature),
    m_body(nullptr),
    m_name(nullptr),
    m_customReader(nullptr),
    m_nameLength(0),
    m_number(number),
    m_locals(alloc, signature->GetParamCount())
#if DBG_DUMP
    , importedFunctionReference(nullptr)
#endif
{
    for (Js::ArgSlot i = 0; i < signature->GetParamCount(); ++i)
    {
        m_locals.Add(signature->GetParam(i));
    }
}